

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall
spirv_cross::Compiler::CombinedImageSamplerHandler::end_function_scope
          (CombinedImageSamplerHandler *this,uint32_t *args,uint32_t length)

{
  SPIRFunction *caller;
  size_t sVar1;
  SPIRFunction *pSVar2;
  _Elt_pointer ppSVar3;
  VariableID *pVVar4;
  SPIRVariable *pSVar5;
  SPIRVariable *pSVar6;
  VariableID *pVVar7;
  VariableID image_id;
  VariableID *pVVar8;
  VariableID sampler_id;
  long lVar9;
  
  if (2 < length) {
    pSVar2 = Variant::get<spirv_cross::SPIRFunction>
                       ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                        args[2]);
    ::std::
    deque<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_std::allocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
    ::pop_back(&(this->parameter_remapping).c);
    pSVar2->do_combined_parameters = false;
    ppSVar3 = (this->functions).c.
              super__Deque_base<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppSVar3 ==
        (this->functions).c.
        super__Deque_base<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppSVar3 = (this->functions).c.
                super__Deque_base<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pSVar2 = ppSVar3[-1];
    ::std::deque<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>::
    pop_back(&(this->functions).c);
    ppSVar3 = (this->functions).c.
              super__Deque_base<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppSVar3 !=
        (this->functions).c.
        super__Deque_base<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      if (ppSVar3 ==
          (this->functions).c.
          super__Deque_base<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppSVar3 = (this->functions).c.
                  super__Deque_base<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      caller = ppSVar3[-1];
      if ((caller->do_combined_parameters == true) &&
         (sVar1 = (pSVar2->combined_parameters).
                  super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.
                  buffer_size, sVar1 != 0)) {
        pVVar8 = &((pSVar2->combined_parameters).
                   super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.ptr)->
                  sampler_id;
        lVar9 = sVar1 << 4;
        do {
          pVVar4 = pVVar8 + -1;
          if (*(bool *)(pVVar8 + 1) == false) {
            pVVar4 = (VariableID *)(args + (ulong)pVVar4->id + 3);
          }
          pVVar7 = pVVar8;
          if (*(bool *)((long)(pVVar8 + 1) + 1) == false) {
            pVVar7 = (VariableID *)(args + (ulong)pVVar8->id + 3);
          }
          image_id.id = pVVar4->id;
          sampler_id.id = pVVar7->id;
          pSVar5 = maybe_get_backing_variable(this->compiler,image_id.id);
          pSVar6 = maybe_get_backing_variable(this->compiler,sampler_id.id);
          if (pSVar5 != (SPIRVariable *)0x0) {
            image_id.id = (pSVar5->super_IVariant).self.id;
          }
          if (pSVar6 != (SPIRVariable *)0x0) {
            sampler_id.id = (pSVar6->super_IVariant).self.id;
          }
          register_combined_image_sampler
                    (this,caller,(VariableID)0x0,image_id,sampler_id,
                     *(bool *)((long)(pVVar8 + 1) + 2));
          pVVar8 = pVVar8 + 4;
          lVar9 = lVar9 + -0x10;
        } while (lVar9 != 0);
      }
    }
  }
  return 2 < length;
}

Assistant:

bool Compiler::CombinedImageSamplerHandler::end_function_scope(const uint32_t *args, uint32_t length)
{
	if (length < 3)
		return false;

	auto &callee = compiler.get<SPIRFunction>(args[2]);
	args += 3;

	// There are two types of cases we have to handle,
	// a callee might call sampler2D(texture2D, sampler) directly where
	// one or more parameters originate from parameters.
	// Alternatively, we need to provide combined image samplers to our callees,
	// and in this case we need to add those as well.

	pop_remap_parameters();

	// Our callee has now been processed at least once.
	// No point in doing it again.
	callee.do_combined_parameters = false;

	auto &params = functions.top()->combined_parameters;
	functions.pop();
	if (functions.empty())
		return true;

	auto &caller = *functions.top();
	if (caller.do_combined_parameters)
	{
		for (auto &param : params)
		{
			VariableID image_id = param.global_image ? param.image_id : VariableID(args[param.image_id]);
			VariableID sampler_id = param.global_sampler ? param.sampler_id : VariableID(args[param.sampler_id]);

			auto *i = compiler.maybe_get_backing_variable(image_id);
			auto *s = compiler.maybe_get_backing_variable(sampler_id);
			if (i)
				image_id = i->self;
			if (s)
				sampler_id = s->self;

			register_combined_image_sampler(caller, 0, image_id, sampler_id, param.depth);
		}
	}

	return true;
}